

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::MultiBind::ErrorsBindSamplersTest::iterate(ErrorsBindSamplersTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  undefined4 extraout_var;
  TestError *pTVar8;
  int iVar9;
  GLint GVar10;
  GLuint sampler_ids [4];
  GLuint t_sampler_ids [4];
  GLint max_samplers;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  max_samplers = 0;
  (**(code **)(lVar7 + 0x868))(0x8b4d,&max_samplers);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x7b0);
  iVar4 = max_samplers + -1;
  GVar10 = max_samplers;
  if (3 < max_samplers) {
    GVar10 = 4;
    iVar4 = 3;
  }
  (**(code **)(lVar7 + 0x6f0))(4,sampler_ids);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"GenSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x7c0);
  iVar9 = max_samplers + 1;
  iVar2 = 0;
  if (3 < max_samplers) {
    iVar9 = 4;
    iVar2 = max_samplers + -3;
  }
  (**(code **)(lVar7 + 0xb0))(iVar2,iVar9,sampler_ids);
  GVar6 = (**(code **)(lVar7 + 0x800))();
  if (GVar6 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"File: ");
    std::operator<<((ostream *)poVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   );
    std::operator<<((ostream *)poVar1,", line: ");
    std::ostream::operator<<(poVar1,0x7d6);
    std::operator<<((ostream *)poVar1,". Got wrong error: ");
    t_sampler_ids._0_8_ = glu::getErrorName;
    t_sampler_ids[2] = GVar6;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_sampler_ids,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", expected: ");
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = 0x502;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", message: ");
    std::operator<<((ostream *)poVar1,"BindSamplers with invalid <first> + <count>");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7d6);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  t_sampler_ids[2] = sampler_ids[2];
  t_sampler_ids[3] = sampler_ids[3];
  GVar6 = 1;
  while (cVar3 = (**(code **)(lVar7 + 0xcc8))(GVar6), cVar3 == '\x01') {
    GVar6 = GVar6 + 1;
  }
  t_sampler_ids[iVar4] = GVar6;
  (**(code **)(lVar7 + 200))(0,GVar10,t_sampler_ids);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"File: ");
    std::operator<<((ostream *)poVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   );
    std::operator<<((ostream *)poVar1,", line: ");
    std::ostream::operator<<(poVar1,0x7f1);
    std::operator<<((ostream *)poVar1,". Got wrong error: ");
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", expected: ");
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = 0x502;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", message: ");
    std::operator<<((ostream *)poVar1,"BindSamplers with invalid sampler id");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7f1);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar7 + 0x468))(4);
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsBindSamplersTest::iterate()
{
	static const GLsizei n_samplers = 4;

	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLsizei count			= n_samplers;
	GLuint  first			= 0;
	GLuint  invalid_id		= 1; /* Start with 1, as 0 is not valid name */
	GLint   max_samplers	= 0;
	size_t  validated_index = n_samplers - 1;

	/* Get max */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &max_samplers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Select count so <first + count> does not exceed max.
	 * Validated index shall be in the specified range.
	 */
	if (n_samplers > max_samplers)
	{
		count			= max_samplers;
		validated_index = max_samplers - 1;
	}

	/* Storage */
	GLuint sampler_ids[n_samplers];

	/* Prepare samplers */
	gl.genSamplers(n_samplers, sampler_ids);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenSamplers");

	try
	{
		/* - INVALID_OPERATION when <first> + <count> exceed limits; */
		{
			GLsizei t_count = n_samplers;
			GLuint  t_first = 0;

			/* Select first so <first + count> exceeds max, avoid negative first */
			if (n_samplers <= max_samplers)
			{
				t_first = max_samplers - n_samplers + 1;
			}
			else
			{
				t_count = max_samplers + 1;
				/* first = 0; */
			}

			/* Test */
			gl.bindSamplers(t_first, t_count, sampler_ids);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindSamplers with invalid <first> + <count>");
		}

		/* - INVALID_OPERATION if any value in <buffers> is not zero or the name of
		 * existing buffer;
		 */
		{
			GLuint t_sampler_ids[n_samplers];

			memcpy(t_sampler_ids, sampler_ids, sizeof(sampler_ids));

			/* Find invalid id */
			while (1)
			{
				if (GL_TRUE != gl.isTexture(invalid_id))
				{
					break;
				}

				invalid_id += 1;
			}

			/* Invalidate the entry */
			t_sampler_ids[validated_index] = invalid_id;

			/* Test */
			gl.bindTextures(first, count, t_sampler_ids);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindSamplers with invalid sampler id");
		}
	}
	catch (const std::exception&)
	{
		gl.deleteSamplers(n_samplers, sampler_ids);

		TCU_FAIL("Invalid error generated");
	}

	/* Delete samplers */
	gl.deleteSamplers(n_samplers, sampler_ids);

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}